

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QByteArray,QRhiGles2::PipelineCacheData>::emplace<QRhiGles2::PipelineCacheData_const&>
          (QHash<QByteArray,QRhiGles2::PipelineCacheData> *this,QByteArray *key,
          PipelineCacheData *args)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  PipelineCacheData local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_48._0_8_ = (Data *)0x0;
LAB_004ed90c:
    QHash<QByteArray,_QRhiGles2::PipelineCacheData>::detach
              ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)this);
    pVar2 = (piter)emplace_helper<QRhiGles2::PipelineCacheData_const&>(this,key,args);
    QHash<QByteArray,_QRhiGles2::PipelineCacheData>::~QHash
              ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)&local_48);
  }
  else {
    if (1 < *(uint *)&pDVar1->ref) {
      local_48._0_8_ = pDVar1;
      if (*(uint *)&pDVar1->ref != 0xffffffff) {
        LOCK();
        pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
        UNLOCK();
      }
      goto LAB_004ed90c;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QRhiGles2::PipelineCacheData_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_004ed980;
    }
    QRhiGles2::PipelineCacheData::PipelineCacheData(&local_48,args);
    pVar2 = (piter)QHash<QByteArray,_QRhiGles2::PipelineCacheData>::
                   emplace_helper<QRhiGles2::PipelineCacheData>
                             ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)this,key,&local_48)
    ;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48.data.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_004ed980:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }